

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

bool vkt::SpirVAssembly::anon_unknown_5::compareFUnord
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *inputs,vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                        *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  ostringstream *this;
  pointer pSVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool bVar7;
  ulong uVar8;
  undefined1 local_1b0 [384];
  
  if ((long)(outputAllocs->
            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(outputAllocs->
            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pSVar1 = (expectedOutputs->
             super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar3 = (*pSVar1->m_ptr->_vptr_BufferInterface[3])();
    pvVar2 = ((outputAllocs->
              super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_hostPtr;
    iVar4 = (*((inputs->
               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->m_ptr->_vptr_BufferInterface[3])();
    iVar5 = (*((inputs->
               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].m_ptr)->_vptr_BufferInterface[3])();
    iVar6 = (*pSVar1->m_ptr->_vptr_BufferInterface[2])();
    bVar7 = true;
    if (3 < CONCAT44(extraout_var_02,iVar6)) {
      this = (ostringstream *)(local_1b0 + 8);
      bVar7 = true;
      uVar8 = 0;
      do {
        if (*(int *)((long)pvVar2 + uVar8 * 4) != *(int *)(CONCAT44(extraout_var,iVar3) + uVar8 * 4)
           ) {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"ERROR: Sub-case failed. inputs: ",0x20);
          std::ostream::_M_insert<double>
                    ((double)*(float *)(CONCAT44(extraout_var_00,iVar4) + uVar8 * 4));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,",",1);
          std::ostream::_M_insert<double>
                    ((double)*(float *)(CONCAT44(extraout_var_01,iVar5) + uVar8 * 4));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," output: ",9);
          std::ostream::operator<<(this,*(int *)((long)pvVar2 + uVar8 * 4));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this," expected output: ",0x12);
          std::ostream::operator<<(this,*(int *)(CONCAT44(extraout_var,iVar3) + uVar8 * 4));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          bVar7 = false;
        }
        uVar8 = uVar8 + 1;
        iVar6 = (*pSVar1->m_ptr->_vptr_BufferInterface[2])();
      } while (uVar8 < CONCAT44(extraout_var_03,iVar6) >> 2);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool compareFUnord (const std::vector<BufferSp>& inputs, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	if (outputAllocs.size() != 1)
		return false;

	const BufferSp&	expectedOutput			= expectedOutputs[0];
	const deInt32*	expectedOutputAsInt		= static_cast<const deInt32*>(expectedOutputs[0]->data());
	const deInt32*	outputAsInt				= static_cast<const deInt32*>(outputAllocs[0]->getHostPtr());
	const float*	input1AsFloat			= static_cast<const float*>(inputs[0]->data());
	const float*	input2AsFloat			= static_cast<const float*>(inputs[1]->data());
	bool returnValue						= true;

	for (size_t idx = 0; idx < expectedOutput->getNumBytes() / sizeof(deInt32); ++idx)
	{
		if (outputAsInt[idx] != expectedOutputAsInt[idx])
		{
			log << TestLog::Message << "ERROR: Sub-case failed. inputs: " << input1AsFloat[idx] << "," << input2AsFloat[idx] << " output: " << outputAsInt[idx]<< " expected output: " << expectedOutputAsInt[idx] << TestLog::EndMessage;
			returnValue = false;
		}
	}
	return returnValue;
}